

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<SequenceDistanceGraphPath> * __thiscall
pybind11::class_<SequenceDistanceGraphPath>::
def_readwrite<SequenceDistanceGraphPath,std::vector<long,std::allocator<long>>>
          (class_<SequenceDistanceGraphPath> *this,char *name,offset_in_Link_to_long pm)

{
  cpp_function fset;
  cpp_function fget;
  is_method local_40;
  cpp_function local_38;
  is_method local_30;
  is_method local_28;
  
  local_40.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_30.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<SequenceDistanceGraphPath>::def_readwrite<SequenceDistanceGraphPath,std::vector<long,std::allocator<long>>>(char_const*,std::vector<long,std::allocator<long>>SequenceDistanceGraphPath::*)::_lambda(SequenceDistanceGraphPath_const&)_1_,pybind11::is_method,void>
            (&local_38,(type *)&local_30,&local_40);
  local_28.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_30.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<SequenceDistanceGraphPath>::def_readwrite<SequenceDistanceGraphPath,std::vector<long,std::allocator<long>>>(char_const*,std::vector<long,std::allocator<long>>SequenceDistanceGraphPath::*)::_lambda(SequenceDistanceGraphPath&,std::vector<long,std::allocator<long>>const&)_1_,pybind11::is_method,void>
            ((cpp_function *)&local_40,(type *)&local_30,&local_28);
  local_28.class_.m_ptr._0_1_ = 6;
  local_30.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  def_property_static<pybind11::is_method,pybind11::return_value_policy>
            (this,name,&local_38,(cpp_function *)&local_40,&local_30,
             (return_value_policy *)&local_28);
  object::~object((object *)&local_40);
  object::~object((object *)&local_38);
  return this;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra&... extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value, "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D &{ return c.*pm; }, is_method(*this)),
                     fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }